

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.hpp
# Opt level: O0

List<Callback::Listener::Signal> * __thiscall
List<Callback::Listener::Signal>::operator=
          (List<Callback::Listener::Signal> *this,List<Callback::Listener::Signal> *other)

{
  Item *end;
  Item *i;
  List<Callback::Listener::Signal> *other_local;
  List<Callback::Listener::Signal> *this_local;
  
  clear(this);
  for (end = (other->_begin).item; end != &other->endItem; end = end->next) {
    append(this,&end->value);
  }
  return this;
}

Assistant:

List& operator=(const List& other)
  {
    clear();
    for(const Item* i = other._begin.item, * end = &other.endItem; i != end; i = i->next)
      append(i->value);
    return *this;
  }